

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5lib.c
# Opt level: O0

int decrypt(EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  char local_148 [8];
  char block [272];
  int lblock;
  char *seed;
  size_t lseed;
  char *cyphertext;
  size_t lcyphertext;
  lua_State *L_local;
  
  lcyphertext = (size_t)ctx;
  pcVar2 = luaL_checklstring((lua_State *)ctx,1,(size_t *)&cyphertext);
  cVar1 = *pcVar2;
  uVar3 = (ulong)cVar1;
  if ((cyphertext < (char *)(uVar3 + 1)) || (0x10 < uVar3)) {
    luaL_argerror((lua_State *)lcyphertext,1,"invalid cyphered string");
  }
  cyphertext = cyphertext + -(uVar3 + 1);
  block._268_4_ = initblock((lua_State *)lcyphertext,pcVar2 + 1,(int)cVar1,local_148);
  decodestream((lua_State *)lcyphertext,pcVar2 + uVar3 + 1,(size_t)cyphertext,local_148,
               block._268_4_);
  return 1;
}

Assistant:

static int decrypt (lua_State *L) {
  size_t lcyphertext;
  const char *cyphertext = luaL_checklstring(L, 1, &lcyphertext);
  size_t lseed = cyphertext[0];
  const char *seed = cyphertext+1;
  int lblock;
  char block[BLOCKSIZE+MAXKEY];
  luaL_argcheck(L, lcyphertext >= lseed+1 && lseed <= BLOCKSIZE, 1,
                 "invalid cyphered string");
  cyphertext += lseed+1;
  lcyphertext -= lseed+1;
  lblock = initblock(L, seed, lseed, block);
  decodestream(L, cyphertext, lcyphertext, block, lblock);
  return 1;
}